

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O1

void __thiscall
Js::JavascriptNativeArray::SetArrayCallSite
          (JavascriptNativeArray *this,ProfileId index,
          RecyclerWeakReference<Js::FunctionBody> *weakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (weakRef == (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f4,"(weakRef)","weakRef");
    if (!bVar2) goto LAB_00a79184;
    *puVar3 = 0;
  }
  if ((this->weakRefToFuncBody).ptr != (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f5,"(!weakRefToFuncBody)","!weakRefToFuncBody");
    if (!bVar2) {
LAB_00a79184:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicObject::SetArrayCallSiteIndex((DynamicObject *)this,index);
  Memory::Recycler::WBSetBit((char *)&this->weakRefToFuncBody);
  (this->weakRefToFuncBody).ptr = weakRef;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefToFuncBody);
  return;
}

Assistant:

void SetArrayCallSite(ProfileId index, RecyclerWeakReference<FunctionBody> *weakRef)
        {
            Assert(weakRef);
            Assert(!weakRefToFuncBody);
            SetArrayCallSiteIndex(index);
            weakRefToFuncBody = weakRef;
        }